

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivConstant.cpp
# Opt level: O3

void TPZShapeHDivConstant<pzshape::TPZShapeTriang>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZVec<int> *sideorient,
               TPZShapeData *data)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  TPZManVector<int,_20> local_a0;
  
  piVar1 = local_a0.fExtAlloc;
  local_a0.super_TPZVec<int>.fStore = (int *)0x0;
  local_a0.super_TPZVec<int>.fNElements = 0;
  local_a0.super_TPZVec<int>.fNAlloc = 0;
  local_a0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018237a0;
  uVar7 = sideorient->fNElements;
  if ((long)uVar7 < 0x15) {
    local_a0.super_TPZVec<int>.fStore = piVar1;
    if ((long)uVar7 < 1) goto LAB_010109fd;
  }
  else {
    local_a0.super_TPZVec<int>.fStore =
         (int *)operator_new__(-(ulong)(uVar7 >> 0x3e != 0) | uVar7 * 4);
    local_a0.super_TPZVec<int>.fNAlloc = uVar7;
  }
  piVar2 = sideorient->fStore;
  uVar6 = 0;
  do {
    local_a0.super_TPZVec<int>.fStore[uVar6] = piVar2[uVar6];
    uVar6 = uVar6 + 1;
  } while (uVar7 != uVar6);
LAB_010109fd:
  local_a0.super_TPZVec<int>.fNElements = uVar7;
  TPZManVector<int,_20>::operator=(&data->fSideOrient,&local_a0);
  if (local_a0.super_TPZVec<int>.fStore != piVar1) {
    local_a0.super_TPZVec<int>.fNAlloc = 0;
    local_a0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if (local_a0.super_TPZVec<int>.fStore != (int *)0x0) {
      operator_delete__(local_a0.super_TPZVec<int>.fStore);
    }
  }
  TPZManVector<int,_27>::Resize(&data->fHDivConnectOrders,4);
  TPZManVector<int,_27>::Resize(&data->fHDivNumConnectShape,4);
  piVar1 = connectorders->fStore;
  lVar8 = connectorders->fNElements;
  uVar5 = (uint)lVar8;
  if (0 < (int)uVar5) {
    uVar7 = 0;
    do {
      piVar2 = piVar1 + uVar7;
      *piVar2 = *piVar2 + 1;
      uVar7 = uVar7 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar7);
  }
  piVar1 = (int *)((long)piVar1 + ((lVar8 << 0x20) + -0x100000000 >> 0x1e));
  *piVar1 = *piVar1 + 1;
  TPZShapeH1<pzshape::TPZShapeTriang>::Initialize(ids,connectorders,data);
  piVar1 = connectorders->fStore;
  piVar2 = (data->fHDivConnectOrders).super_TPZVec<int>.fStore;
  piVar3 = (data->fH1NumConnectShape).super_TPZVec<int>.fStore;
  piVar4 = (data->fHDivNumConnectShape).super_TPZVec<int>.fStore;
  lVar8 = 0;
  do {
    piVar2[lVar8] = piVar1[lVar8];
    piVar4[lVar8] = piVar3[lVar8] + 1;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  piVar2[3] = piVar1[3];
  piVar4[3] = piVar3[3];
  return;
}

Assistant:

void TPZShapeHDivConstant<TSHAPE>::Initialize(TPZVec<int64_t> &ids,
                TPZVec<int> &connectorders,
                const TPZVec<int>& sideorient, 
                TPZShapeData &data)
{
    data.fSideOrient = sideorient;
    data.fHDivConnectOrders.Resize(TSHAPE::NFacets+1);
    data.fHDivNumConnectShape.Resize(TSHAPE::NFacets+1);
    if(TSHAPE::Dimension == 2)
    {
        //Compatibilize the polynomial order
        int conSize = connectorders.size();
        for (int i = 0; i < conSize; i++){
            connectorders[i]++;
        }
        if (TSHAPE::Type() == ETriangle){
            connectorders[conSize-1]++;
        }
        //Initialize data structures
        TPZShapeH1<TSHAPE>::Initialize(ids,connectorders,data);

        for(int ic = 0; ic<TSHAPE::NFacets;ic++)
        {
            data.fHDivConnectOrders[ic] =  connectorders[ic];
            data.fHDivNumConnectShape[ic] = data.fH1NumConnectShape[ic]+1;
        }
        int ic = TSHAPE::NFacets;
        data.fHDivConnectOrders[ic] =  connectorders[ic];
        data.fHDivNumConnectShape[ic] = data.fH1NumConnectShape[ic];
    }
    else
    {
        //Compatibilize the polynomial order
        if (TSHAPE::Type() == ETetraedro) {
            int conSize = connectorders.size();
            for (int i = 0; i < conSize; i++){
                connectorders[i]++;
            }
            connectorders[conSize-1]++;
        }

        const int nedges = TSHAPE::NSides-TSHAPE::NFacets-TSHAPE::NCornerNodes-1;
        TPZManVector<int,15> locconorders(TSHAPE::NSides-TSHAPE::NCornerNodes,1);
        for(int ic = nedges; ic<TSHAPE::NSides-TSHAPE::NCornerNodes; ic++)
        {
            locconorders[ic] = connectorders[ic-nedges];
        }
        TPZShapeHCurlNoGrads<TSHAPE>::Initialize(ids, locconorders, data);
//        TPZManVector<int> HCurlNumConnectShapeF = data.fHDivNumConnectShape;
//        data.fHDivNumConnectShape.Resize(TSHAPE::NFacets+1);
//        for(int ic=nedges; ic<TSHAPE::NSides-TSHAPE::NCornerNodes-1; ic++)
//        {
//            int numshape = HCurlNumConnectShapeF[ic]+1;
//            data.fHDivNumConnectShape[ic-nedges] = numshape;
//        }
//        int ic = TSHAPE::NSides-TSHAPE::NCornerNodes-1;
//        int numshape = HCurlNumConnectShapeF[ic];
//        data.fHDivNumConnectShape[ic-nedges] = numshape;
    }
}